

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O3

size_t HUF_initRemainingDStream
                 (BIT_DStream_t *bit,HUF_DecompressFastArgs *args,int stream,BYTE *segmentEnd)

{
  ulong uVar1;
  BYTE *pBVar2;
  long lVar3;
  size_t sVar4;
  
  sVar4 = 0xffffffffffffffec;
  if ((args->op[stream] <= segmentEnd) && (args->iend[stream] + -8 <= args->ip[stream])) {
    bit->bitContainer = *(size_t *)args->ip[stream];
    uVar1 = args->bits[stream];
    if (uVar1 == 0) {
      __assert_fail("val != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bits.h"
                    ,0x5c,"unsigned int ZSTD_countTrailingZeros64(U64)");
    }
    lVar3 = 0;
    if (uVar1 != 0) {
      for (; (uVar1 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
      }
    }
    bit->bitsConsumed = (uint)lVar3;
    pBVar2 = args->iend[0];
    bit->start = (char *)pBVar2;
    bit->limitPtr = (char *)(pBVar2 + 8);
    bit->ptr = (char *)args->ip[stream];
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

static size_t HUF_initRemainingDStream(BIT_DStream_t* bit, HUF_DecompressFastArgs const* args, int stream, BYTE* segmentEnd)
{
    /* Validate that we haven't overwritten. */
    if (args->op[stream] > segmentEnd)
        return ERROR(corruption_detected);
    /* Validate that we haven't read beyond iend[].
        * Note that ip[] may be < iend[] because the MSB is
        * the next bit to read, and we may have consumed 100%
        * of the stream, so down to iend[i] - 8 is valid.
        */
    if (args->ip[stream] < args->iend[stream] - 8)
        return ERROR(corruption_detected);

    /* Construct the BIT_DStream_t. */
    assert(sizeof(size_t) == 8);
    bit->bitContainer = MEM_readLEST(args->ip[stream]);
    bit->bitsConsumed = ZSTD_countTrailingZeros64(args->bits[stream]);
    bit->start = (const char*)args->iend[0];
    bit->limitPtr = bit->start + sizeof(size_t);
    bit->ptr = (const char*)args->ip[stream];

    return 0;
}